

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tester.h
# Opt level: O2

void __thiscall MemMat<int>::MemMat(MemMat<int> *this,Mat_<int> *img)

{
  undefined4 uVar1;
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  int local_8c;
  Size local_88;
  Mat_<int> local_80;
  
  cv::Mat_<int>::Mat_(&this->img_);
  cv::Mat_<int>::Mat_(&this->accesses_);
  cv::Mat_<int>::clone(&local_80,(__fn *)img,__child_stack,in_ECX,in_R8);
  cv::Mat::operator=(&(this->img_).super_Mat,&local_80.super_Mat);
  cv::Mat::~Mat(&local_80.super_Mat);
  local_88.height = (int)**(undefined8 **)&img->field_0x40;
  local_88.width = (int)((ulong)**(undefined8 **)&img->field_0x40 >> 0x20);
  local_8c = 0;
  cv::Mat_<int>::Mat_(&local_80,&local_88,&local_8c);
  cv::Mat::operator=(&(this->accesses_).super_Mat,&local_80.super_Mat);
  cv::Mat::~Mat(&local_80.super_Mat);
  uVar1 = *(undefined4 *)&img->field_0xc;
  this->rows = *(undefined4 *)&img->field_0x8;
  this->cols = uVar1;
  return;
}

Assistant:

MemMat(cv::Mat_<T> img)
    {
        img_ = img.clone(); // Deep copy
        accesses_ = cv::Mat1i(img.size(), 0);
        rows = img.rows;
        cols = img.cols;
    }